

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v6::internal::
     handle_dynamic_spec<fmt::v6::internal::width_checker,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
               (int *value,arg_ref<char> ref,
               basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
               *ctx)

{
  unsigned_long_long uVar1;
  error_handler local_89;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_88;
  int local_78;
  undefined8 local_74;
  undefined4 local_6c;
  width_checker<fmt::v6::internal::error_handler> local_60;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_58;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_38 [2];
  
  if (ref.kind == name) {
    basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::arg
              ((format_arg *)&local_38[0].string,ctx,ref.val.name);
    local_58.long_long_value = local_38[0].long_long_value;
    local_58.string.size = local_38[0].string.size;
    local_48 = (int)local_38[1]._0_8_;
    uStack_44 = (undefined4)((ulong)local_38[1]._0_8_ >> 0x20);
    uStack_40 = (undefined4)local_38[1]._8_8_;
    uStack_3c = (undefined4)((ulong)local_38[1]._8_8_ >> 0x20);
  }
  else {
    if (ref.kind != index) {
      return;
    }
    basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::do_get((format_arg *)&local_88.string,&ctx->args_,ref.val.index);
    if (local_78 == 1) {
      local_88.string.size = *(size_t *)(local_88.long_long_value + 0x18);
      local_78 = *(int *)(local_88.long_long_value + 0x20);
      local_88.long_long_value = *(long *)(local_88.long_long_value + 0x10);
    }
    local_58.long_long_value = local_88.long_long_value;
    local_58.string.size = local_88.string.size;
    local_48 = local_78;
    uStack_44 = (undefined4)local_74;
    uStack_40 = (undefined4)((ulong)local_74 >> 0x20);
    uStack_3c = local_6c;
  }
  local_60.handler_ = &local_89;
  uVar1 = visit_format_arg<fmt::v6::internal::width_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                    (&local_60,
                     (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_58.string);
  if ((uVar1 & 0xffffffff80000000) == 0) {
    *value = (int)uVar1;
    return;
  }
  error_handler::on_error(&local_89,"number is too big");
}

Assistant:

void handle_dynamic_spec(int& value, arg_ref<typename Context::char_type> ref,
                         Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = internal::get_dynamic_spec<Handler>(ctx.arg(ref.val.index),
                                                ctx.error_handler());
    break;
  case arg_id_kind::name:
    value = internal::get_dynamic_spec<Handler>(ctx.arg(ref.val.name),
                                                ctx.error_handler());
    break;
  }
}